

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.h
# Opt level: O0

void __thiscall
r_exec::CInput::CInput(CInput *this,View *input,_Fact *abstraction,BindingMap *bindings)

{
  uint64_t uVar1;
  BindingMap *bindings_local;
  _Fact *abstraction_local;
  View *input_local;
  CInput *this_local;
  
  core::P<r_exec::BindingMap>::P(&this->bindings,bindings);
  core::P<r_exec::_Fact>::P(&this->abstraction,abstraction);
  core::P<r_exec::View>::P(&this->input,input);
  this->injected = false;
  uVar1 = r_code::View::get_ijt(&input->super_View);
  this->ijt = uVar1;
  return;
}

Assistant:

CInput(View *input, _Fact *abstraction, BindingMap *bindings): bindings(bindings), abstraction(abstraction), input(input), injected(false), ijt(input->get_ijt()) {}